

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O0

void asmjit::v1_14::EmitterUtils::logInstructionEmitted
               (BaseAssembler *self,InstId instId,InstOptions options,Operand_ *o0,Operand_ *o1,
               Operand_ *o2,Operand_ *opExt,uint32_t relSize,uint32_t immSize,uint8_t *afterCursor)

{
  FormatFlags a;
  long *plVar1;
  bool bVar2;
  Operand_ *in_RCX;
  long in_RDI;
  Operand_ *in_R8;
  Operand_ *in_R9;
  Operand_ *in_stack_00000008;
  Operand_ opArray [6];
  intptr_t emittedSize;
  uint8_t *beforeCursor;
  FormatFlags formatFlags;
  StringTmp<256UL> sb;
  char *in_stack_000000e0;
  int in_stack_000000ec;
  char *in_stack_000000f0;
  Logger *logger;
  FormatIndentationGroup *in_stack_fffffffffffffce8;
  StringTmp<256UL> *this;
  Array<unsigned_char,_4UL> *in_stack_fffffffffffffcf0;
  size_t in_stack_fffffffffffffcf8;
  undefined8 in_stack_fffffffffffffd00;
  String *in_stack_fffffffffffffd08;
  undefined1 local_2d8 [8];
  undefined8 local_2d0;
  size_t in_stack_fffffffffffffd38;
  uint32_t in_stack_fffffffffffffd40 [2];
  size_t in_stack_fffffffffffffd48;
  uint8_t *in_stack_fffffffffffffd50;
  FormatOptions *in_stack_fffffffffffffd58;
  String *in_stack_fffffffffffffd60;
  StringTmp<256UL> local_250;
  undefined1 auStack_24f [7];
  ulong local_248;
  undefined1 *local_238;
  char *in_stack_fffffffffffffe30;
  
  plVar1 = *(long **)(in_RDI + 0x38);
  if (plVar1 == (long *)0x0) {
    DebugUtils::assertionFailed(in_stack_000000f0,in_stack_000000ec,in_stack_000000e0);
  }
  memset(&local_250,0,0x20);
  StringTmp<256UL>::_resetToTemporary(&local_250);
  a = *(FormatFlags *)(plVar1 + 1);
  opArrayFromEmitArgs((Operand_ *)&stack0xfffffffffffffd38,in_RCX,in_R8,in_R9,in_stack_00000008);
  Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::FormatIndentationGroup>
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  String::_opChars(in_stack_fffffffffffffd08,(ModifyOp)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                   (char)((ulong)in_stack_fffffffffffffd00 >> 0x18),in_stack_fffffffffffffcf8);
  local_2d0 = *(undefined8 *)(in_RDI + 0x58);
  (**(code **)(in_RDI + 0x80))
            (&local_250,a,in_RDI,*(undefined1 *)(in_RDI + 0x48),local_2d8,&stack0xfffffffffffffd38,6
            );
  bVar2 = Support::test<asmjit::v1_14::FormatFlags,asmjit::v1_14::FormatFlags>(a,kMachineCode);
  if (bVar2) {
    this = *(StringTmp<256UL> **)(in_RDI + 0x60);
    finishFormattedLine(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                        in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                        (size_t)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                        in_stack_fffffffffffffe30);
  }
  else {
    this = *(StringTmp<256UL> **)(in_RDI + 0x60);
    finishFormattedLine(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                        in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                        (size_t)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                        in_stack_fffffffffffffe30);
  }
  if ((byte)local_250 < 0x1f) {
    local_238 = auStack_24f;
    local_248 = (ulong)(byte)local_250;
  }
  (**(code **)(*plVar1 + 0x10))(plVar1,local_238,local_248);
  StringTmp<256UL>::~StringTmp(this);
  return;
}

Assistant:

void logInstructionEmitted(
  BaseAssembler* self,
  InstId instId,
  InstOptions options,
  const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_* opExt,
  uint32_t relSize, uint32_t immSize, uint8_t* afterCursor) {

  Logger* logger = self->logger();
  ASMJIT_ASSERT(logger != nullptr);

  StringTmp<256> sb;
  FormatFlags formatFlags = logger->flags();

  uint8_t* beforeCursor = self->bufferPtr();
  intptr_t emittedSize = (intptr_t)(afterCursor - beforeCursor);

  Operand_ opArray[Globals::kMaxOpCount];
  opArrayFromEmitArgs(opArray, o0, o1, o2, opExt);

  sb.appendChars(' ', logger->indentation(FormatIndentationGroup::kCode));
  self->_funcs.formatInstruction(sb, formatFlags, self, self->arch(), BaseInst(instId, options, self->extraReg()), opArray, Globals::kMaxOpCount);

  if (Support::test(formatFlags, FormatFlags::kMachineCode))
    finishFormattedLine(sb, logger->options(), self->bufferPtr(), size_t(emittedSize), relSize, immSize, self->inlineComment());
  else
    finishFormattedLine(sb, logger->options(), nullptr, SIZE_MAX, 0, 0, self->inlineComment());
  logger->log(sb);
}